

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryPacking.cpp
# Opt level: O1

void __thiscall wasm::MemoryPacking::optimizeSegmentOps(MemoryPacking *this,Module *module)

{
  size_type *psVar1;
  undefined1 local_120 [8];
  Optimizer optimizer;
  
  psVar1 = &optimizer.
            super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>.
            super_Pass.name._M_string_length;
  optimizer.super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>.
  super_Pass.name._M_dataplus._M_p = (pointer)0x0;
  optimizer.super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>.
  super_Pass.name._M_string_length._0_1_ = 0;
  optimizer.super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>.
  super_Pass.name.field_2._8_8_ = 0;
  optimizer.super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>.
  super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
  super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.replacep = (Expression **)0x0;
  optimizer.super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>.
  super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
  super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.stack.fixed._M_elems[9].currp =
       (Expression **)0x0;
  optimizer.super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>.
  super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
  super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task,_std::allocator<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  optimizer.super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>.
  super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
  super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task,_std::allocator<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  optimizer.super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>.
  super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
  super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task,_std::allocator<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optimizer.super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>.
  super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
  super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.currFunction = (Function *)0x0;
  local_120 = (undefined1  [8])&PTR__WalkerPass_00d894f8;
  optimizer.super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>.
  super_Pass._vptr_Pass = (_func_int **)(this->super_Pass).runner;
  optimizer.super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>.
  super_Pass.runner = (PassRunner *)psVar1;
  WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>::run
            ((WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_> *)local_120,
             module);
  if (optimizer.super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>.
      super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
      super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.stack.fixed._M_elems[9].currp !=
      (Expression **)0x0) {
    operator_delete(optimizer.
                    super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>.
                    super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
                    super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.stack.fixed._M_elems[9]
                    .currp,(long)optimizer.
                                 super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>
                                 .super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
                                 super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.stack.
                                 flexible.
                                 super__Vector_base<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task,_std::allocator<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)optimizer.
                                 super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>
                                 .super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
                                 super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.stack.
                                 fixed._M_elems[9].currp);
  }
  local_120 = (undefined1  [8])&PTR__Pass_00d87048;
  if (optimizer.super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>.
      super_Pass.runner != (PassRunner *)psVar1) {
    operator_delete(optimizer.
                    super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>.
                    super_Pass.runner,
                    CONCAT71(optimizer.
                             super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>
                             .super_Pass.name._M_string_length._1_7_,
                             (undefined1)
                             optimizer.
                             super_WalkerPass<wasm::PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>_>
                             .super_Pass.name._M_string_length) + 1);
  }
  return;
}

Assistant:

void MemoryPacking::optimizeSegmentOps(Module* module) {
  struct Optimizer : WalkerPass<PostWalker<Optimizer>> {
    bool isFunctionParallel() override { return true; }

    // This operates on linear memory, and does not affect reference locals.
    bool requiresNonNullableLocalFixups() override { return false; }

    std::unique_ptr<Pass> create() override {
      return std::make_unique<Optimizer>();
    }

    bool needsRefinalizing;

    void visitMemoryInit(MemoryInit* curr) {
      Builder builder(*getModule());
      auto* segment = getModule()->getDataSegment(curr->segment);
      size_t maxRuntimeSize = segment->isPassive ? segment->data.size() : 0;
      bool mustNop = false;
      bool mustTrap = false;
      auto* offset = curr->offset->dynCast<Const>();
      auto* size = curr->size->dynCast<Const>();
      if (offset && uint32_t(offset->value.geti32()) > maxRuntimeSize) {
        mustTrap = true;
      }
      if (size && uint32_t(size->value.geti32()) > maxRuntimeSize) {
        mustTrap = true;
      }
      if (offset && size) {
        uint64_t offsetVal(offset->value.geti32());
        uint64_t sizeVal(size->value.geti32());
        if (offsetVal + sizeVal > maxRuntimeSize) {
          mustTrap = true;
        } else if (offsetVal == 0 && sizeVal == 0) {
          mustNop = true;
        }
      }
      assert(!mustNop || !mustTrap);
      if (mustNop) {
        // Offset and size are 0, so just trap if dest > memory.size
        replaceCurrent(
          builder.makeIf(makeGtShiftedMemorySize(builder, *getModule(), curr),
                         builder.makeUnreachable()));
      } else if (mustTrap) {
        // Drop dest, offset, and size then trap
        replaceCurrent(builder.blockify(builder.makeDrop(curr->dest),
                                        builder.makeDrop(curr->offset),
                                        builder.makeDrop(curr->size),
                                        builder.makeUnreachable()));
        needsRefinalizing = true;
      } else if (!segment->isPassive) {
        // trap if (dest > memory.size | offset | size) != 0
        replaceCurrent(builder.makeIf(
          builder.makeBinary(
            OrInt32,
            makeGtShiftedMemorySize(builder, *getModule(), curr),
            builder.makeBinary(OrInt32, curr->offset, curr->size)),
          builder.makeUnreachable()));
      }
    }
    void visitDataDrop(DataDrop* curr) {
      if (!getModule()->getDataSegment(curr->segment)->isPassive) {
        ExpressionManipulator::nop(curr);
      }
    }
    void doWalkFunction(Function* func) {
      needsRefinalizing = false;
      super::doWalkFunction(func);
      if (needsRefinalizing) {
        ReFinalize().walkFunctionInModule(func, getModule());
      }
    }
  } optimizer;
  optimizer.run(getPassRunner(), module);
}